

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_ls.c
# Opt level: O0

int kinLs_AccessLMem(void *kinmem,char *fname,KINMem *kin_mem,KINLsMem *kinls_mem)

{
  KINLsMem *kinls_mem_local;
  KINMem *kin_mem_local;
  char *fname_local;
  void *kinmem_local;
  
  if (kinmem == (void *)0x0) {
    KINProcessError((KINMem)0x0,-1,"KINLS",fname,"KINSOL memory is NULL.");
    kinmem_local._4_4_ = -1;
  }
  else {
    *kin_mem = (KINMem)kinmem;
    if ((*kin_mem)->kin_lmem == (void *)0x0) {
      KINProcessError(*kin_mem,-2,"KINLS",fname,"Linear solver memory is NULL.");
      kinmem_local._4_4_ = -2;
    }
    else {
      *kinls_mem = (KINLsMem)(*kin_mem)->kin_lmem;
      kinmem_local._4_4_ = 0;
    }
  }
  return kinmem_local._4_4_;
}

Assistant:

int kinLs_AccessLMem(void* kinmem, const char *fname,
                     KINMem *kin_mem, KINLsMem *kinls_mem)
{
  if (kinmem==NULL) {
    KINProcessError(NULL, KINLS_MEM_NULL, "KINLS",
                    fname, MSG_LS_KINMEM_NULL);
    return(KINLS_MEM_NULL);
  }
  *kin_mem = (KINMem) kinmem;
  if ((*kin_mem)->kin_lmem==NULL) {
    KINProcessError(*kin_mem, KINLS_LMEM_NULL, "KINLS",
                    fname, MSG_LS_LMEM_NULL);
    return(KINLS_LMEM_NULL);
  }
  *kinls_mem = (KINLsMem) (*kin_mem)->kin_lmem;
  return(KINLS_SUCCESS);
}